

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_force(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *argument_00;
  CHAR_DATA *pCVar4;
  CHAR_DATA *pCVar5;
  char *txt;
  char buf [4608];
  char arg [4608];
  char arg2 [4608];
  char acStack_3638 [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  argument_00 = one_argument(argument,local_2438);
  txt = "Force whom to do what?\n\r";
  if ((local_2438[0] == '\0') || (*argument_00 == '\0')) goto LAB_002715ea;
  one_argument(argument_00,local_1238);
  bVar1 = str_cmp(local_1238,"delete");
  txt = "That will NOT be done.\n\r";
  if (!bVar1) goto LAB_002715ea;
  bVar1 = str_prefix(local_1238,"mob");
  if (!bVar1) goto LAB_002715ea;
  sprintf(acStack_3638,"$n forces you to \'%s\'.",argument_00);
  bVar1 = str_cmp(local_2438,"all");
  if (bVar1) {
    bVar1 = str_cmp(local_2438,"players");
    if (bVar1) {
      bVar1 = str_cmp(local_2438,"gods");
      if (bVar1) {
        pCVar4 = get_char_world(ch,local_2438);
        if (pCVar4 == (CHAR_DATA *)0x0) {
          txt = "They aren\'t here.\n\r";
          goto LAB_002715ea;
        }
        if (pCVar4 == ch) {
          txt = "Aye aye, right away!\n\r";
          goto LAB_002715ea;
        }
        bVar1 = is_room_owner(ch,pCVar4->in_room);
        if ((!bVar1) && (ch->in_room != pCVar4->in_room)) {
          bVar1 = room_is_private(pCVar4->in_room);
          if (bVar1) {
            bVar1 = is_trusted(ch,0x3c);
            if (!bVar1) {
              txt = "That character is in a private room.\n\r";
              goto LAB_002715ea;
            }
          }
        }
        iVar2 = get_trust(pCVar4);
        iVar3 = get_trust(ch);
        if (iVar3 <= iVar2) {
          txt = "Do it yourself!\n\r";
          goto LAB_002715ea;
        }
        bVar1 = is_npc(pCVar4);
        if (!bVar1) {
          iVar2 = get_trust(ch);
          if (iVar2 < 0x39) goto LAB_002715e3;
        }
        act(acStack_3638,ch,(void *)0x0,pCVar4,2);
        interpret(pCVar4,argument_00);
        txt = "Ok.\n\r";
        goto LAB_002715ea;
      }
      iVar2 = get_trust(ch);
      if (0x39 < iVar2) {
        txt = "Ok.\n\r";
        pCVar4 = char_list;
        while (pCVar5 = pCVar4, pCVar5 != (CHAR_DATA *)0x0) {
          pCVar4 = pCVar5->next;
          bVar1 = is_npc(pCVar5);
          if (!bVar1) {
            iVar2 = get_trust(pCVar5);
            iVar3 = get_trust(ch);
            if ((iVar2 < iVar3) && (0x32 < pCVar5->level)) {
              act(acStack_3638,ch,(void *)0x0,pCVar5,2);
              interpret(pCVar5,argument_00);
            }
          }
        }
        goto LAB_002715ea;
      }
    }
    else {
      iVar2 = get_trust(ch);
      if (0x39 < iVar2) {
        txt = "Ok.\n\r";
        pCVar4 = char_list;
        while (pCVar5 = pCVar4, pCVar5 != (CHAR_DATA *)0x0) {
          pCVar4 = pCVar5->next;
          bVar1 = is_npc(pCVar5);
          if (!bVar1) {
            iVar2 = get_trust(pCVar5);
            iVar3 = get_trust(ch);
            if ((iVar2 < iVar3) && (pCVar5->level < 0x33)) {
              act(acStack_3638,ch,(void *)0x0,pCVar5,2);
              interpret(pCVar5,argument_00);
            }
          }
        }
        goto LAB_002715ea;
      }
    }
LAB_002715e3:
    txt = "Not at your level!\n\r";
  }
  else {
    iVar2 = get_trust(ch);
    if (iVar2 < 0x39) {
      bVar1 = str_cmp(local_1238,"save");
      if (bVar1) goto LAB_002715e3;
    }
    txt = "Ok.\n\r";
    pCVar4 = char_list;
    while (pCVar5 = pCVar4, pCVar5 != (CHAR_DATA *)0x0) {
      pCVar4 = pCVar5->next;
      bVar1 = is_npc(pCVar5);
      if (!bVar1) {
        iVar2 = get_trust(pCVar5);
        iVar3 = get_trust(ch);
        if (iVar2 < iVar3) {
          bVar1 = can_see(pCVar5,ch);
          if (!bVar1) {
            sprintf(acStack_3638,"An irresistible urge forces you to \'%s\'.",argument_00);
          }
          act(acStack_3638,ch,(void *)0x0,pCVar5,2);
          interpret(pCVar5,argument_00);
        }
      }
    }
  }
LAB_002715ea:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_force(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *vch, *vch_next;
	char buf[MAX_STRING_LENGTH];
	char arg[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];

	argument = one_argument(argument, arg);

	if (arg[0] == '\0' || argument[0] == '\0')
	{
		send_to_char("Force whom to do what?\n\r", ch);
		return;
	}

	one_argument(argument, arg2);

	if (!str_cmp(arg2, "delete") || !str_prefix(arg2, "mob"))
	{
		send_to_char("That will NOT be done.\n\r", ch);
		return;
	}

	sprintf(buf, "$n forces you to '%s'.", argument);

	if (!str_cmp(arg, "all"))
	{
		if (get_trust(ch) < MAX_LEVEL - 3 && str_cmp(arg2, "save"))
		{
			send_to_char("Not at your level!\n\r", ch);
			return;
		}

		for (vch = char_list; vch != nullptr; vch = vch_next)
		{
			vch_next = vch->next;

			if (!is_npc(vch) && get_trust(vch) < get_trust(ch))
			{
				if (!can_see(vch, ch))
					sprintf(buf, "An irresistible urge forces you to '%s'.", argument);

				act(buf, ch, nullptr, vch, TO_VICT);
				interpret(vch, argument);
			}
		}
	}
	else if (!str_cmp(arg, "players"))
	{
		if (get_trust(ch) < MAX_LEVEL - 2)
		{
			send_to_char("Not at your level!\n\r", ch);
			return;
		}

		for (vch = char_list; vch != nullptr; vch = vch_next)
		{
			vch_next = vch->next;

			if (!is_npc(vch) && get_trust(vch) < get_trust(ch) && vch->level < LEVEL_HERO)
			{
				act(buf, ch, nullptr, vch, TO_VICT);
				interpret(vch, argument);
			}
		}
	}
	else if (!str_cmp(arg, "gods"))
	{
		if (get_trust(ch) < MAX_LEVEL - 2)
		{
			send_to_char("Not at your level!\n\r", ch);
			return;
		}

		for (vch = char_list; vch != nullptr; vch = vch_next)
		{
			vch_next = vch->next;

			if (!is_npc(vch) && get_trust(vch) < get_trust(ch) && vch->level >= LEVEL_HERO)
			{
				act(buf, ch, nullptr, vch, TO_VICT);
				interpret(vch, argument);
			}
		}
	}
	else
	{
		CHAR_DATA *victim = get_char_world(ch, arg);

		if (victim == nullptr)
		{
			send_to_char("They aren't here.\n\r", ch);
			return;
		}

		if (victim == ch)
		{
			send_to_char("Aye aye, right away!\n\r", ch);
			return;
		}

		/*
		if(victim->desc == nullptr)
		{
			send_to_char("They have no descriptor!\n\r",ch);
			return;
		}
		*/

		if (!is_room_owner(ch, victim->in_room)
			&& ch->in_room != victim->in_room
			&& room_is_private(victim->in_room)
			&& !is_trusted(ch, IMPLEMENTOR))
		{
			send_to_char("That character is in a private room.\n\r", ch);
			return;
		}

		if (get_trust(victim) >= get_trust(ch))
		{
			send_to_char("Do it yourself!\n\r", ch);
			return;
		}

		if (!is_npc(victim) && get_trust(ch) < MAX_LEVEL - 3)
		{
			send_to_char("Not at your level!\n\r", ch);
			return;
		}

		act(buf, ch, nullptr, victim, TO_VICT);
		interpret(victim, argument);
	}

	send_to_char("Ok.\n\r", ch);
}